

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserver.cpp
# Opt level: O1

void __thiscall EOServer::Tick(EOServer *this)

{
  list<Client_*,_std::allocator<Client_*>_> *plVar1;
  EOServer *pEVar2;
  World *pWVar3;
  pointer ppCVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  IPAddress IVar8;
  Client *pCVar9;
  mapped_type *pmVar10;
  _Node_iterator_base<std::pair<const_IPAddress,_ConnectionLogEntry>,_true> it;
  mapped_type *pmVar11;
  vector<Client_*,_std::allocator<Client_*>_> *pvVar12;
  char *reason;
  pointer ppCVar13;
  int iVar14;
  EOServer *this_00;
  vector<Client_*,_std::allocator<Client_*>_> *__range2;
  _List_node_base *p_Var15;
  bool bVar16;
  double dVar17;
  double dVar18;
  IPAddress remote_addr;
  IPAddress local_7c;
  undefined1 local_78 [32];
  Client *local_58;
  double local_50;
  int local_48;
  IPAddress local_44;
  EOServer *local_40;
  double local_38;
  
  pCVar9 = Server::Poll(&this->super_Server);
  if (pCVar9 != (Client *)0x0) {
    dVar17 = Timer::GetTime();
    local_7c = Client::GetRemoteAddr(pCVar9);
    pWVar3 = this->world;
    pEVar2 = (EOServer *)(local_78 + 0x10);
    local_78._0_8_ = pEVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"IPReconnectLimit","");
    pmVar10 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar3->config,(key_type *)local_78);
    local_38 = util::variant::GetFloat(pmVar10);
    if ((EOServer *)local_78._0_8_ != pEVar2) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    pWVar3 = this->world;
    local_78._0_8_ = pEVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"MaxConnectionsPerIP","");
    pmVar10 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar3->config,(key_type *)local_78);
    local_48 = util::variant::GetInt(pmVar10);
    this_00 = (EOServer *)local_78._0_8_;
    local_58 = pCVar9;
    if ((EOServer *)local_78._0_8_ != pEVar2) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    local_40 = (EOServer *)&this->connection_log;
    it._M_cur = (__node_type *)(this->connection_log)._M_h._M_before_begin._M_nxt;
    iVar14 = 0;
    if (it._M_cur == (__node_type *)0x0) {
      bVar16 = false;
    }
    else {
      bVar16 = false;
      do {
        dVar18 = *(double *)((long)it._M_cur + 0x10) + local_38;
        if ((dVar17 <= dVar18) || (dVar17 <= *(double *)((long)it._M_cur + 0x18) + 30.0)) {
          this_00 = (EOServer *)((long)it._M_cur + 8);
          local_50 = dVar18;
          bVar5 = IPAddress::operator==((IPAddress *)this_00,&local_7c);
          bVar7 = bVar16;
          if (bVar5) {
            bVar7 = true;
          }
          if (local_50 < dVar17) {
            bVar7 = bVar16;
          }
          bVar16 = bVar7;
          bVar6 = 0;
        }
        else {
          ClearClientRejections(this_00,(connection_log_iterator)it._M_cur);
          this_00 = local_40;
          it._M_cur = (__node_type *)
                      std::
                      _Hashtable<IPAddress,_std::pair<const_IPAddress,_ConnectionLogEntry>,_std::allocator<std::pair<const_IPAddress,_ConnectionLogEntry>_>,_std::__detail::_Select1st,_std::equal_to<IPAddress>,_std::hash<IPAddress>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::erase((_Hashtable<IPAddress,_std::pair<const_IPAddress,_ConnectionLogEntry>,_std::allocator<std::pair<const_IPAddress,_ConnectionLogEntry>_>,_std::__detail::_Select1st,_std::equal_to<IPAddress>,_std::hash<IPAddress>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)local_40,it._M_cur);
          bVar6 = (it._M_cur != (__node_type *)0x0) * '\x02' + 2;
        }
      } while (((bVar6 & 3) == 0) &&
              (it._M_cur = (__node_type *)((it._M_cur)->super__Hash_node_base)._M_nxt,
              it._M_cur != (__node_type *)0x0));
    }
    pCVar9 = local_58;
    plVar1 = &(this->super_Server).clients;
    p_Var15 = (this->super_Server).clients.super__List_base<Client_*,_std::allocator<Client_*>_>.
              _M_impl._M_node.super__List_node_base._M_next;
    if (p_Var15 != (_List_node_base *)plVar1) {
      iVar14 = 0;
      do {
        IVar8 = Client::GetRemoteAddr((Client *)p_Var15[1]._M_next);
        local_78._0_4_ = IVar8.address;
        local_44 = Client::GetRemoteAddr(pCVar9);
        bVar7 = IPAddress::operator==((IPAddress *)local_78,&local_44);
        iVar14 = iVar14 + (uint)bVar7;
        p_Var15 = p_Var15->_M_next;
      } while (p_Var15 != (_List_node_base *)plVar1);
    }
    pCVar9 = local_58;
    if (bVar16) {
      IVar8 = Client::GetRemoteAddr(local_58);
      local_78._0_4_ = IVar8.address;
      reason = "reconnecting too fast";
    }
    else {
      if ((local_48 == 0) || (iVar14 <= local_48)) {
        local_50 = Timer::GetTime();
        pmVar11 = std::__detail::
                  _Map_base<IPAddress,_std::pair<const_IPAddress,_ConnectionLogEntry>,_std::allocator<std::pair<const_IPAddress,_ConnectionLogEntry>_>,_std::__detail::_Select1st,_std::equal_to<IPAddress>,_std::hash<IPAddress>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<IPAddress,_std::pair<const_IPAddress,_ConnectionLogEntry>,_std::allocator<std::pair<const_IPAddress,_ConnectionLogEntry>_>,_std::__detail::_Select1st,_std::equal_to<IPAddress>,_std::hash<IPAddress>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_40,&local_7c);
        pmVar11->last_connection_time = local_50;
        goto LAB_0014e503;
      }
      IVar8 = Client::GetRemoteAddr(local_58);
      local_78._0_4_ = IVar8.address;
      reason = "too many connections from this address";
    }
    RecordClientRejection(this,(IPAddress *)local_78,reason);
    Client::Close(pCVar9,true);
  }
LAB_0014e503:
  pvVar12 = Server::Select(&this->super_Server,0.001);
  if (pvVar12 != (vector<Client_*,_std::allocator<Client_*>_> *)0x0) {
    ppCVar4 = (pvVar12->super__Vector_base<Client_*,_std::allocator<Client_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppCVar13 = (pvVar12->super__Vector_base<Client_*,_std::allocator<Client_*>_>)._M_impl.
                    super__Vector_impl_data._M_start; ppCVar13 != ppCVar4; ppCVar13 = ppCVar13 + 1)
    {
      EOClient::Tick((EOClient *)*ppCVar13);
    }
    ppCVar13 = (pvVar12->super__Vector_base<Client_*,_std::allocator<Client_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    if ((pvVar12->super__Vector_base<Client_*,_std::allocator<Client_*>_>)._M_impl.
        super__Vector_impl_data._M_finish != ppCVar13) {
      (pvVar12->super__Vector_base<Client_*,_std::allocator<Client_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = ppCVar13;
    }
  }
  Server::BuryTheDead(&this->super_Server);
  Timer::Tick(&this->world->timer);
  return;
}

Assistant:

void EOServer::Tick()
{
	std::vector<Client *> *active_clients = 0;
	EOClient *newclient = static_cast<EOClient *>(this->Poll());

	if (newclient)
	{
		double now = Timer::GetTime();
		int ip_connections = 0;
		bool throttle = false;
		IPAddress remote_addr = newclient->GetRemoteAddr();

		const double reconnect_limit = double(this->world->config["IPReconnectLimit"]);
		const int max_per_ip = int(this->world->config["MaxConnectionsPerIP"]);

		UTIL_IFOREACH(connection_log, connection)
		{
			double last_connection_time = connection->second.last_connection_time;
			double last_rejection_time = connection->second.last_rejection_time;

			if (last_connection_time + reconnect_limit < now
			 && last_rejection_time + 30.0 < now)
			{
				this->ClearClientRejections(connection);
				connection = connection_log.erase(connection);

				if (connection == connection_log.end())
					break;

				continue;
			}

			if (connection->first == remote_addr
			 && last_connection_time + reconnect_limit >= now)
			{
				throttle = true;
			}
		}

		UTIL_FOREACH(this->clients, client)
		{
			if (client->GetRemoteAddr() == newclient->GetRemoteAddr())
			{
				++ip_connections;
			}
		}

		if (throttle)
		{
			this->RecordClientRejection(newclient->GetRemoteAddr(), "reconnecting too fast");
			newclient->Close(true);
		}
		else if (max_per_ip != 0 && ip_connections > max_per_ip)
		{
			this->RecordClientRejection(newclient->GetRemoteAddr(), "too many connections from this address");
			newclient->Close(true);
		}
		else
		{
			connection_log[remote_addr].last_connection_time = Timer::GetTime();
		}
	}

	try
	{
		active_clients = this->Select(0.001);
	}
	catch (Socket_SelectFailed &e)
	{
		if (errno != EINTR)
			throw;
	}

	if (active_clients)
	{
		UTIL_FOREACH(*active_clients, client)
		{
			EOClient *eoclient = static_cast<EOClient *>(client);
			eoclient->Tick();
		}

		active_clients->clear();
	}

	this->BuryTheDead();

	this->world->timer.Tick();
}